

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall ot::commissioner::Timer::Start(Timer *this,TimePoint aFireTime)

{
  int iVar1;
  rep rVar2;
  undefined1 local_40 [8];
  timeval tv;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> delay;
  Timer *this_local;
  TimePoint aFireTime_local;
  
  delay.__r = (rep)this;
  this_local = (Timer *)aFireTime.__d.__r;
  if ((this->mEnabled & 1U) != 0) {
    Stop(this);
  }
  tv.tv_usec = std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&this_local,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&tv.tv_usec);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  tv.tv_sec = 0;
  local_40 = (undefined1  [8])0x0;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
  local_40 = (undefined1  [8])(rVar2 / 1000000);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
  tv.tv_sec = rVar2 % 1000000;
  iVar1 = event_add(&this->mTimerEvent,(timeval *)local_40);
  if (iVar1 != 0) {
    abort();
  }
  (this->mFireTime).__d.__r = (rep)this_local;
  this->mEnabled = true;
  return;
}

Assistant:

void Start(TimePoint aFireTime)
    {
        // In case the timer has already been started, stop it first.
        if (mEnabled)
        {
            Stop();
        }

        auto delay = std::chrono::duration_cast<std::chrono::microseconds>(aFireTime - Clock::now());

        struct timeval tv;
        evutil_timerclear(&tv);
        tv.tv_sec  = delay.count() / 1000000;
        tv.tv_usec = delay.count() % 1000000;

        VerifyOrDie(event_add(&mTimerEvent, &tv) == 0);
        mFireTime = aFireTime;
        mEnabled  = true;
    }